

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

string * __thiscall
CoreML::ShapeConstraint::name_abi_cxx11_(string *__return_storage_ptr__,ShapeConstraint *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_name);
  return __return_storage_ptr__;
}

Assistant:

std::string ShapeConstraint::name() const {
    return _name;
}